

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

void __thiscall MakefileGenerator::filterIncludedFiles(MakefileGenerator *this,char *var)

{
  QMakeProject *this_00;
  int iVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  QList<ProString> *this_01;
  long lVar5;
  iterator aend;
  iterator iVar6;
  long lVar7;
  const_iterator cVar8;
  ProString *pPVar9;
  const_iterator cVar10;
  ProString *pPVar11;
  long in_FS_OFFSET;
  ProKey local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->project;
  ProKey::ProKey(&local_68,var);
  this_01 = &QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,&local_68)->
             super_QList<ProString>;
  if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pPVar11 = (this_01->d).ptr;
  lVar5 = (this_01->d).size;
  lVar7 = lVar5 >> 2;
  cVar8.i = pPVar11;
  local_68.super_ProString.m_string.d.d = (Data *)this;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>
              ::operator()((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *)
                           &local_68,cVar8);
      cVar10.i = cVar8.i;
      if (bVar3) goto LAB_001646b9;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>
              ::operator()((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *)
                           &local_68,cVar8.i + 1);
      cVar10.i = cVar8.i + 1;
      if (bVar3) goto LAB_001646b9;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>
              ::operator()((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *)
                           &local_68,cVar8.i + 2);
      cVar10.i = cVar8.i + 2;
      if (bVar3) goto LAB_001646b9;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>
              ::operator()((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *)
                           &local_68,cVar8.i + 3);
      cVar10.i = cVar8.i + 3;
      if (bVar3) goto LAB_001646b9;
      cVar8.i = cVar8.i + 4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  pPVar9 = pPVar11 + lVar5;
  lVar5 = ((long)pPVar9 - (long)cVar8.i >> 4) * -0x5555555555555555;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      cVar10.i = pPVar9;
      if ((lVar5 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>::operator()
                            ((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *
                             )&local_68,cVar8), cVar10.i = cVar8.i, bVar3)) goto LAB_001646b9;
      cVar8.i = cVar8.i + 1;
    }
    bVar3 = __gnu_cxx::__ops::_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>::
            operator()((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *)
                       &local_68,cVar8);
    cVar10.i = cVar8.i;
    if (bVar3) goto LAB_001646b9;
    cVar8.i = cVar8.i + 1;
  }
  bVar3 = __gnu_cxx::__ops::_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>::
          operator()((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *)
                     &local_68,cVar8);
  cVar10.i = pPVar9;
  if (bVar3) {
    cVar10.i = cVar8.i;
  }
LAB_001646b9:
  lVar5 = (long)cVar10.i - (long)pPVar11;
  if ((lVar5 >> 4) * -0x5555555555555555 - (this_01->d).size != 0) {
    aend = QList<ProString>::end(this_01);
    iVar6 = QList<ProString>::begin(this_01);
    cVar8.i = iVar6.i + lVar5;
    pPVar11 = iVar6.i + lVar5 + 0x30;
    if (pPVar11 != aend.i) {
      do {
        ProString::toQString((QString *)&local_68,pPVar11);
        iVar4 = QMakeSourceFileInfo::included(&this->super_QMakeSourceFileInfo,(QString *)&local_68)
        ;
        if ((MakefileGenerator *)local_68.super_ProString.m_string.d.d != (MakefileGenerator *)0x0)
        {
          LOCK();
          *(int *)&((QMakeSourceFileInfo *)
                   &(local_68.super_ProString.m_string.d.d)->super_QArrayData)->
                   _vptr_QMakeSourceFileInfo =
               *(int *)&((QMakeSourceFileInfo *)
                        &(local_68.super_ProString.m_string.d.d)->super_QArrayData)->
                        _vptr_QMakeSourceFileInfo + -1;
          UNLOCK();
          if (*(int *)&((QMakeSourceFileInfo *)
                       &(local_68.super_ProString.m_string.d.d)->super_QArrayData)->
                       _vptr_QMakeSourceFileInfo == 0) {
            QArrayData::deallocate
                      (&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (iVar4 < 1) {
          QString::operator=(&(cVar8.i)->m_string,(QString *)pPVar11);
          iVar4 = pPVar11->m_length;
          iVar1 = pPVar11->m_file;
          uVar2 = *(undefined4 *)&pPVar11->field_0x24;
          (cVar8.i)->m_offset = pPVar11->m_offset;
          (cVar8.i)->m_length = iVar4;
          (cVar8.i)->m_file = iVar1;
          *(undefined4 *)&(cVar8.i)->field_0x24 = uVar2;
          (cVar8.i)->m_hash = pPVar11->m_hash;
          cVar8.i = cVar8.i + 1;
        }
        pPVar11 = pPVar11 + 1;
      } while (pPVar11 != aend.i);
    }
    QList<ProString>::erase(this_01,cVar8,(const_iterator)aend.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::filterIncludedFiles(const char *var)
{
    ProStringList &inputs = project->values(var);
    auto isIncluded = [this](const ProString &input) {
        return QMakeSourceFileInfo::included(input.toQString()) > 0;
    };
    inputs.removeIf(isIncluded);
}